

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O2

int __thiscall prometheus::Gateway::Delete(Gateway *this)

{
  int iVar1;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  iVar1 = detail::CurlWrapper::performHttpRequest
                    ((this->curlWrapper_)._M_t.
                     super___uniq_ptr_impl<prometheus::detail::CurlWrapper,_std::default_delete<prometheus::detail::CurlWrapper>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_prometheus::detail::CurlWrapper_*,_std::default_delete<prometheus::detail::CurlWrapper>_>
                     .super__Head_base<0UL,_prometheus::detail::CurlWrapper_*,_false>._M_head_impl,
                     Delete,&this->jobUri_,&local_28);
  ::std::__cxx11::string::~string((string *)&local_28);
  return iVar1;
}

Assistant:

int Gateway::Delete() {
  return curlWrapper_->performHttpRequest(detail::HttpMethod::Delete, jobUri_);
}